

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

void quaternion_axis_between_EXP(quaternion *self,quaternion *qT,quaternion *qR)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = (qT->field_0).q[0];
  dVar2 = (self->field_0).q[0];
  dVar3 = (self->field_0).q[1];
  dVar4 = (self->field_0).q[2];
  dVar5 = (qT->field_0).q[1];
  dVar6 = (qT->field_0).q[2];
  (qR->field_0).q[0] = dVar6 * dVar3 - dVar4 * dVar5;
  (qR->field_0).q[1] = dVar1 * dVar4 - dVar2 * dVar6;
  (qR->field_0).q[2] = dVar2 * dVar5 - dVar1 * dVar3;
  (qR->field_0).q[3] = -(dVar6 * dVar4 + dVar2 * dVar1 + dVar3 * dVar5);
  quaternion_normalize(qR);
  return;
}

Assistant:

HYPAPI struct quaternion quaternion_cross_product_EXP(const struct quaternion *self, const struct quaternion *vT)
{
	/*
	 * The code is suspect (missing w element in this whole thing)
	 * It is computing a cross-product on the vector portion and a
	 * negative dot product on the real portion.
	 */
	struct quaternion r;

	r.x = (self->y * vT->z) - (self->z * vT->y);
	r.y = (self->z * vT->x) - (self->x * vT->z);
	r.z = (self->x * vT->y) - (self->y * vT->x);
	r.w = -((self->x * vT->x) + (self->y * vT->y) + (self->z * vT->z));

	return r;
}